

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence_helpers.cpp
# Opt level: O0

SENode * __thiscall
spvtools::opt::LoopDependenceAnalysis::GetUpperBound(LoopDependenceAnalysis *this,Loop *loop)

{
  Op OVar1;
  Instruction *instruction;
  Instruction *inst;
  SENode *pSVar2;
  SENode *pSVar3;
  SENode *upper_bound_2;
  SENode *upper_bound_1;
  SENode *upper_bound;
  Instruction *upper_inst;
  Instruction *cond_inst;
  Loop *loop_local;
  LoopDependenceAnalysis *this_local;
  
  instruction = Loop::GetConditionInst(loop);
  if (instruction == (Instruction *)0x0) {
    this_local = (LoopDependenceAnalysis *)0x0;
  }
  else {
    inst = GetOperandDefinition(this,instruction,1);
    OVar1 = Instruction::opcode(instruction);
    if (OVar1 - OpUGreaterThan < 2) {
      pSVar3 = ScalarEvolutionAnalysis::AnalyzeInstruction(&this->scalar_evolution_,inst);
      pSVar2 = ScalarEvolutionAnalysis::CreateConstant(&this->scalar_evolution_,1);
      pSVar3 = ScalarEvolutionAnalysis::CreateAddNode(&this->scalar_evolution_,pSVar3,pSVar2);
      this_local = (LoopDependenceAnalysis *)
                   ScalarEvolutionAnalysis::SimplifyExpression(&this->scalar_evolution_,pSVar3);
    }
    else {
      if (1 < OVar1 - OpUGreaterThanEqual) {
        if (OVar1 - OpULessThan < 2) {
          pSVar3 = ScalarEvolutionAnalysis::AnalyzeInstruction(&this->scalar_evolution_,inst);
          pSVar2 = ScalarEvolutionAnalysis::CreateConstant(&this->scalar_evolution_,1);
          pSVar3 = ScalarEvolutionAnalysis::CreateSubtraction
                             (&this->scalar_evolution_,pSVar3,pSVar2);
          pSVar3 = ScalarEvolutionAnalysis::SimplifyExpression(&this->scalar_evolution_,pSVar3);
          return pSVar3;
        }
        if (1 < OVar1 - OpULessThanEqual) {
          return (SENode *)0x0;
        }
      }
      pSVar3 = ScalarEvolutionAnalysis::AnalyzeInstruction(&this->scalar_evolution_,inst);
      this_local = (LoopDependenceAnalysis *)
                   ScalarEvolutionAnalysis::SimplifyExpression(&this->scalar_evolution_,pSVar3);
    }
  }
  return (SENode *)this_local;
}

Assistant:

SENode* LoopDependenceAnalysis::GetUpperBound(const Loop* loop) {
  Instruction* cond_inst = loop->GetConditionInst();
  if (!cond_inst) {
    return nullptr;
  }
  Instruction* upper_inst = GetOperandDefinition(cond_inst, 1);
  switch (cond_inst->opcode()) {
    case spv::Op::OpULessThan:
    case spv::Op::OpSLessThan: {
      // When we have a < condition we must subtract 1 from the analyzed upper
      // instruction.
      SENode* upper_bound = scalar_evolution_.SimplifyExpression(
          scalar_evolution_.CreateSubtraction(
              scalar_evolution_.AnalyzeInstruction(upper_inst),
              scalar_evolution_.CreateConstant(1)));
      return upper_bound;
    }
    case spv::Op::OpUGreaterThan:
    case spv::Op::OpSGreaterThan: {
      // When we have a > condition we must add 1 to the analyzed upper
      // instruction.
      SENode* upper_bound =
          scalar_evolution_.SimplifyExpression(scalar_evolution_.CreateAddNode(
              scalar_evolution_.AnalyzeInstruction(upper_inst),
              scalar_evolution_.CreateConstant(1)));
      return upper_bound;
    }
    case spv::Op::OpULessThanEqual:
    case spv::Op::OpSLessThanEqual:
    case spv::Op::OpUGreaterThanEqual:
    case spv::Op::OpSGreaterThanEqual: {
      // We don't need to modify the results of analyzing when we have <= or >=.
      SENode* upper_bound = scalar_evolution_.SimplifyExpression(
          scalar_evolution_.AnalyzeInstruction(upper_inst));
      return upper_bound;
    }
    default:
      return nullptr;
  }
}